

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_reference_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::PositionalReferenceExpression::Copy(PositionalReferenceExpression *this)

{
  tuple<duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  this_00;
  pointer pPVar1;
  long in_RSI;
  __uniq_ptr_impl<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
        )operator_new(0x40);
  PositionalReferenceExpression
            ((PositionalReferenceExpression *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
             .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl,
             *(idx_t *)(in_RSI + 0x38));
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
  .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl =
       (tuple<duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
        )(tuple<duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
          )this_00.
           super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
           .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl;
  pPVar1 = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
           ::operator->((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                         *)&local_20);
  (pPVar1->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pPVar1->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pPVar1->super_ParsedExpression).super_BaseExpression.alias);
  (pPVar1->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::PositionalReferenceExpression_*,_std::default_delete<duckdb::PositionalReferenceExpression>_>
       .super__Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> PositionalReferenceExpression::Copy() const {
	auto copy = make_uniq<PositionalReferenceExpression>(index);
	copy->CopyProperties(*this);
	return std::move(copy);
}